

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O1

long __thiscall glcts::AdvancedManyDrawCalls2::Run(AdvancedManyDrawCalls2 *this)

{
  CallLogWrapper *this_00;
  GLsizei width;
  bool bVar1;
  GLuint GVar2;
  void *pvVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int *piVar4;
  ulong uVar5;
  int iVar6;
  GLuint i;
  ulong uVar7;
  long lVar8;
  GLint p2;
  GLuint data;
  GLint p1;
  char *glsl_fs;
  char *glsl_vs;
  int local_6c [3];
  string local_60;
  char *local_40;
  char *local_38;
  
  this_00 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x92d0,local_6c + 2);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x92d6,local_6c);
  if ((local_6c[2] < 1) || (local_6c[0] < 1)) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,
               "GL_MAX_FRAGMENT_ATOMIC_COUNTER_BUFFERS or GL_MAX_FRAGMENT_ATOMIC_COUNTERS are less than required"
               ,"");
    deqp::SubcaseBase::OutputNotSupported((SubcaseBase *)this,&local_60);
    lVar8 = 0x10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_38 = 
    "#version 310 es\nvoid main() {\n#ifdef GL_ES\n  gl_PointSize = 1.0f;\n#endif\n  gl_Position = vec4(0, 0, 0, 1);\n}"
    ;
    local_40 = 
    "#version 310 es\nlayout(binding = 0) uniform atomic_uint g_counter;\nlayout(std430, binding = 0) buffer Output {\n  uint g_output[];\n};\nvoid main() {\n  uint c = atomicCounterIncrement(g_counter);\n  g_output[c] = c;\n}"
    ;
    GVar2 = glu::CallLogWrapper::glCreateShaderProgramv(this_00,0x8b31,1,&local_38);
    this->m_vsp = GVar2;
    GVar2 = glu::CallLogWrapper::glCreateShaderProgramv(this_00,0x8b30,1,&local_40);
    this->m_fsp = GVar2;
    bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckProgram
                      (&this->super_SACSubcaseBase,this->m_vsp);
    lVar8 = -1;
    if (bVar1) {
      bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckProgram
                        (&this->super_SACSubcaseBase,this->m_fsp);
      if (bVar1) {
        glu::CallLogWrapper::glUseProgramStages(this_00,this->m_ppo,1,this->m_vsp);
        glu::CallLogWrapper::glUseProgramStages(this_00,this->m_ppo,2,this->m_fsp);
        glu::CallLogWrapper::glBindBufferBase(this_00,0x92c0,0,this->m_acbo);
        local_6c[1] = 0;
        glu::CallLogWrapper::glBufferData(this_00,0x92c0,4,local_6c + 1,0x88ea);
        pvVar3 = operator_new(4000);
        lVar8 = 0;
        do {
          *(undefined4 *)((long)pvVar3 + lVar8) = 0xffff;
          lVar8 = lVar8 + 4;
        } while (lVar8 != 4000);
        glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_ssbo);
        glu::CallLogWrapper::glBufferData(this_00,0x90d2,4000,pvVar3,0x88e9);
        operator_delete(pvVar3,4000);
        glu::CallLogWrapper::glViewport(this_00,0,0,1,1);
        glu::CallLogWrapper::glBindProgramPipeline(this_00,this->m_ppo);
        glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
        iVar6 = 100;
        do {
          glu::CallLogWrapper::glDrawArrays(this_00,0,0,1);
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
        iVar6 = (*((this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.m_context)->
                  m_renderCtx->_vptr_RenderContext[4])();
        width = *(GLsizei *)CONCAT44(extraout_var,iVar6);
        iVar6 = (*((this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.m_context)->
                  m_renderCtx->_vptr_RenderContext[4])();
        lVar8 = 0;
        glu::CallLogWrapper::glViewport
                  (this_00,0,0,width,*(GLsizei *)(CONCAT44(extraout_var_00,iVar6) + 4));
        glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,this->m_acbo);
        glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
        piVar4 = (int *)glu::CallLogWrapper::glMapBufferRange(this_00,0x92c0,0,4,1);
        if (*piVar4 != 100) {
          glcts::anon_unknown_0::Output("AC buffer content is %u, sholud be 100.\n");
          lVar8 = -1;
        }
        glu::CallLogWrapper::glUnmapBuffer(this_00,0x92c0);
        glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
        glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_ssbo);
        glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
        pvVar3 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,400,3);
        std::__introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (pvVar3,(long)pvVar3 + 400,0xc);
        std::__final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
                  (pvVar3,(long)pvVar3 + 400);
        uVar7 = 0;
        do {
          uVar5 = (ulong)*(uint *)((long)pvVar3 + uVar7 * 4);
          if (uVar7 != uVar5) {
            glcts::anon_unknown_0::Output
                      ("data[%u] is %u, should be %u.\n",uVar7 & 0xffffffff,uVar5,uVar7 & 0xffffffff
                      );
            lVar8 = -1;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != 100);
        glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
        glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
      }
    }
  }
  return lVar8;
}

Assistant:

virtual long Run()
	{

		GLint p1, p2;
		glGetIntegerv(GL_MAX_FRAGMENT_ATOMIC_COUNTER_BUFFERS, &p1);
		glGetIntegerv(GL_MAX_FRAGMENT_ATOMIC_COUNTERS, &p2);
		if (p1 < 1 || p2 < 1)
		{
			OutputNotSupported(
				"GL_MAX_FRAGMENT_ATOMIC_COUNTER_BUFFERS or GL_MAX_FRAGMENT_ATOMIC_COUNTERS are less than required");
			return NOT_SUPPORTED;
		}

		const char* const glsl_vs = "#version 310 es" NL "void main() {" NL "#ifdef GL_ES" NL
									"  gl_PointSize = 1.0f;" NL "#endif" NL "  gl_Position = vec4(0, 0, 0, 1);" NL "}";
		const char* const glsl_fs =
			"#version 310 es" NL "layout(binding = 0) uniform atomic_uint g_counter;" NL
			"layout(std430, binding = 0) buffer Output {" NL "  uint g_output[];" NL "};" NL "void main() {" NL
			"  uint c = atomicCounterIncrement(g_counter);" NL "  g_output[c] = c;" NL "}";

		m_vsp = glCreateShaderProgramv(GL_VERTEX_SHADER, 1, &glsl_vs);
		m_fsp = glCreateShaderProgramv(GL_FRAGMENT_SHADER, 1, &glsl_fs);
		if (!CheckProgram(m_vsp) || !CheckProgram(m_fsp))
			return ERROR;

		glUseProgramStages(m_ppo, GL_VERTEX_SHADER_BIT, m_vsp);
		glUseProgramStages(m_ppo, GL_FRAGMENT_SHADER_BIT, m_fsp);

		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, m_acbo);
		{
			GLuint data = 0;
			glBufferData(GL_ATOMIC_COUNTER_BUFFER, 4, &data, GL_DYNAMIC_COPY);
		}

		{
			std::vector<GLuint> data(1000, 0xffff);
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_ssbo);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)(data.size() * 4), &data[0], GL_DYNAMIC_READ);
		}

		// draw
		glViewport(0, 0, 1, 1);
		glBindProgramPipeline(m_ppo);
		glBindVertexArray(m_vao);
		for (int i = 0; i < 100; ++i)
		{
			glDrawArrays(GL_POINTS, 0, 1);
		}

		glViewport(0, 0, getWindowWidth(), getWindowHeight());

		long status = NO_ERROR;

		{
			GLuint* data;

			glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, m_acbo);
			glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
			data = static_cast<GLuint*>(glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, 4, GL_MAP_READ_BIT));
			if (data[0] != 100)
			{
				status = ERROR;
				Output("AC buffer content is %u, sholud be 100.\n", data[0]);
			}
			glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
			glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_ssbo);
			glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
			data = static_cast<GLuint*>(
				glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 100 * 4, GL_MAP_READ_BIT | GL_MAP_WRITE_BIT));
			std::sort(data, data + 100);
			for (GLuint i = 0; i < 100; ++i)
			{
				if (data[i] != i)
				{
					status = ERROR;
					Output("data[%u] is %u, should be %u.\n", i, data[i], i);
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		}

		return status;
	}